

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Types.hpp
# Opt level: O2

bool __thiscall Doublet::operator==(Doublet *this,Doublet *rhs)

{
  bool bVar1;
  __type _Var2;
  
  bVar1 = std::operator==(&(this->left).ijk,&(rhs->left).ijk);
  if (bVar1) {
    bVar1 = std::operator==(&(this->right).ijk,&(rhs->right).ijk);
    if ((bVar1) && (this->type == rhs->type)) {
      _Var2 = std::operator==(&this->tag,&rhs->tag);
      return _Var2;
    }
  }
  return false;
}

Assistant:

bool operator==(const Doublet & rhs) const
    {
        return (left == rhs.left &&
                right == rhs.right &&
                type == rhs.type &&
                tag == rhs.tag);
    }